

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O3

QRegion * __thiscall QRegion::operator+=(QRegion *this,QRegion *r)

{
  int iVar1;
  int iVar2;
  QRegionPrivate *pQVar3;
  QRegionPrivate *r_00;
  bool bVar4;
  QRect *pQVar5;
  QRect *pQVar6;
  
  pQVar3 = this->d->qt_rgn;
  if (pQVar3 != (QRegionPrivate *)0x0) {
    iVar1 = pQVar3->numRects;
    if ((long)iVar1 != 0) {
      r_00 = r->d->qt_rgn;
      if (r_00 == (QRegionPrivate *)0x0) {
        return this;
      }
      if (this->d == r->d || r_00->numRects == 0) {
        return this;
      }
      if (((((pQVar3->innerRect).x1.m_i <= (r_00->extents).x1.m_i) &&
           ((r_00->extents).x2.m_i <= (pQVar3->innerRect).x2.m_i)) &&
          ((pQVar3->innerRect).y1.m_i <= (r_00->extents).y1.m_i)) &&
         ((r_00->extents).y2.m_i <= (pQVar3->innerRect).y2.m_i)) {
        return this;
      }
      if ((((pQVar3->extents).x1.m_i < (r_00->innerRect).x1.m_i) ||
          ((r_00->innerRect).x2.m_i < (pQVar3->extents).x2.m_i)) ||
         (((pQVar3->extents).y1.m_i < (r_00->innerRect).y1.m_i ||
          ((r_00->innerRect).y2.m_i < (pQVar3->extents).y2.m_i)))) {
        if (r_00->numRects == 1) {
          pQVar6 = &r_00->extents;
        }
        else {
          pQVar6 = (r_00->rects).d.ptr;
        }
        pQVar5 = (pQVar3->rects).d.ptr + (long)iVar1 + -1;
        if (iVar1 == 1) {
          pQVar5 = &pQVar3->extents;
        }
        iVar1 = (pQVar6->y1).m_i;
        iVar2 = (pQVar5->y2).m_i;
        if ((iVar2 < iVar1) ||
           (((iVar1 == (pQVar5->y1).m_i && ((pQVar6->y2).m_i == iVar2)) &&
            ((pQVar5->x2).m_i < (pQVar6->x1).m_i)))) {
          detach(this);
          QRegionPrivate::append(this->d->qt_rgn,r->d->qt_rgn);
          return this;
        }
        bVar4 = QRegionPrivate::canPrepend(pQVar3,r_00);
        if (bVar4) {
          detach(this);
          QRegionPrivate::prepend(this->d->qt_rgn,r->d->qt_rgn);
          return this;
        }
        bVar4 = EqualRegion(this->d->qt_rgn,r->d->qt_rgn);
        if (bVar4) {
          return this;
        }
        detach(this);
        pQVar3 = this->d->qt_rgn;
        UnionRegion(pQVar3,r->d->qt_rgn,pQVar3);
        return this;
      }
    }
  }
  operator=(this,r);
  return this;
}

Assistant:

QRegion& QRegion::operator+=(const QRegion &r)
{
    if (isEmptyHelper(d->qt_rgn))
        return *this = r;
    if (isEmptyHelper(r.d->qt_rgn))
        return *this;
    if (d == r.d)
        return *this;

    if (d->qt_rgn->contains(*r.d->qt_rgn)) {
        return *this;
    } else if (r.d->qt_rgn->contains(*d->qt_rgn)) {
        return *this = r;
    } else if (d->qt_rgn->canAppend(r.d->qt_rgn)) {
        detach();
        d->qt_rgn->append(r.d->qt_rgn);
        return *this;
    } else if (d->qt_rgn->canPrepend(r.d->qt_rgn)) {
        detach();
        d->qt_rgn->prepend(r.d->qt_rgn);
        return *this;
    } else if (EqualRegion(d->qt_rgn, r.d->qt_rgn)) {
        return *this;
    } else {
        detach();
        UnionRegion(d->qt_rgn, r.d->qt_rgn, *d->qt_rgn);
        return *this;
    }
}